

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O3

char * sx_os_path_dirname(char *dst,int size,char *path)

{
  int _num;
  char *pcVar1;
  
  pcVar1 = sx_strrchar(path,'/');
  if ((pcVar1 == (char *)0x0) && (pcVar1 = sx_strrchar(path,'\\'), pcVar1 == (char *)0x0)) {
    if (dst == path) {
      return dst;
    }
    *dst = '\0';
    return dst;
  }
  _num = (int)pcVar1 - (int)path;
  if (dst == path) {
    dst[_num] = '\0';
  }
  else {
    sx_strncpy(dst,size,path,_num);
  }
  return dst;
}

Assistant:

char* sx_os_path_dirname(char* dst, int size, const char* path)
{
    const char* r = sx_strrchar(path, '/');
    if (!r)
        r = sx_strrchar(path, '\\');
    if (r) {
        int o = (int)(intptr_t)(r - path);
        if (dst == path) {
            dst[o] = '\0';
        } else {
            sx_strncpy(dst, size, path, o);
        }
    } else if (dst != path) {
        *dst = '\0';
    }
    return dst;
}